

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O0

string * __thiscall
flatbuffers::IdlNamer::EnumVariant_abi_cxx11_
          (string *__return_storage_ptr__,IdlNamer *this,EnumDef *e,EnumVal *v)

{
  string local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  EnumVal *local_28;
  EnumVal *v_local;
  EnumDef *e_local;
  IdlNamer *this_local;
  
  local_28 = v;
  v_local = (EnumVal *)e;
  e_local = (EnumDef *)this;
  this_local = (IdlNamer *)__return_storage_ptr__;
  Type_abi_cxx11_(&local_68,this,e);
  std::operator+(&local_48,&local_68,&(this->super_Namer).config_.enum_variant_seperator);
  Variant_abi_cxx11_(&local_98,this,local_28);
  std::operator+(__return_storage_ptr__,&local_48,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string EnumVariant(const EnumDef &e, const EnumVal &v) const {
    return Type(e) + config_.enum_variant_seperator + Variant(v);
  }